

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

BlockInformationStruct * __thiscall
cfd::js::api::json::BlockInformation::ConvertToStruct
          (BlockInformationStruct *__return_storage_ptr__,BlockInformation *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined1 local_19;
  BlockInformation *local_18;
  BlockInformation *this_local;
  BlockInformationStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (BlockInformation *)__return_storage_ptr__;
  BlockInformationStruct::BlockInformationStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->block_hash_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_48,&this->tx_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->tx,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  __return_storage_ptr__->version = this->version_;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->version_hex,(string *)&this->version_hex_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->previousblockhash,
             (string *)&this->previousblockhash_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->merkleroot,(string *)&this->merkleroot_);
  __return_storage_ptr__->time = this->time_;
  __return_storage_ptr__->bits = this->bits_;
  __return_storage_ptr__->nonce = this->nonce_;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

BlockInformationStruct BlockInformation::ConvertToStruct() const {  // NOLINT
  BlockInformationStruct result;
  result.block_hash = block_hash_;
  result.tx = tx_.ConvertToStruct();
  result.version = version_;
  result.version_hex = version_hex_;
  result.previousblockhash = previousblockhash_;
  result.merkleroot = merkleroot_;
  result.time = time_;
  result.bits = bits_;
  result.nonce = nonce_;
  result.ignore_items = ignore_items;
  return result;
}